

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_sint.hpp
# Opt level: O0

void ans_sint_decompress(uint32_t *dst,size_t to_decode,uint8_t *cSrc,size_t cSrcSize)

{
  uint32_t uVar1;
  reference pvVar2;
  ulong uVar3;
  long in_RCX;
  uint8_t *in_RDX;
  ulong in_RSI;
  long in_RDI;
  size_t fast_decode;
  uint32_t *out_u32;
  size_t cur_idx;
  uint32_t i;
  array<unsigned_long,_4UL> states;
  ans_sint_decode ans_frame;
  uint8_t *in_u8;
  uint32_t num_states;
  uint32_t in_stack_fffffffffffffef8;
  uint32_t in_stack_fffffffffffffefc;
  uint32_t in_stack_ffffffffffffff00;
  uint32_t in_stack_ffffffffffffff04;
  uint32_t in_stack_ffffffffffffff10;
  uint32_t in_stack_ffffffffffffff14;
  uint32_t in_stack_ffffffffffffff18;
  uint32_t in_stack_ffffffffffffff1c;
  ans_sint_decode *in_stack_ffffffffffffff20;
  ulong local_c8;
  uint local_ac;
  ans_sint_decode local_88;
  uint8_t *local_30;
  undefined4 in_stack_ffffffffffffffd8;
  
  local_30 = in_RDX;
  ans_sint_decode::load((uint8_t *)CONCAT44(4,in_stack_ffffffffffffffd8));
  local_30 = local_30 + in_RCX;
  for (local_ac = 0; local_ac < 4; local_ac = local_ac + 1) {
    in_stack_ffffffffffffff20 = (ans_sint_decode *)ans_sint_decode::init_state(&local_88,&local_30);
    pvVar2 = std::array<unsigned_long,_4UL>::operator[]
                       ((array<unsigned_long,_4UL> *)
                        CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                        CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    *pvVar2 = (value_type_conflict2)in_stack_ffffffffffffff20;
  }
  local_c8 = 0;
  uVar3 = in_RSI - (in_RSI & 3);
  if (local_88.table_type == SINT_SMALL) {
    for (; local_c8 != uVar3; local_c8 = local_c8 + 4) {
      std::array<unsigned_long,_4UL>::operator[]
                ((array<unsigned_long,_4UL> *)
                 CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                 CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      in_stack_ffffffffffffff1c =
           ans_sint_decode::decode_sym<dec_entry_sint_small>
                     (in_stack_ffffffffffffff20,
                      (uint64_t *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                      (uint8_t **)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      *(uint32_t *)(in_RDI + local_c8 * 4) = in_stack_ffffffffffffff1c;
      std::array<unsigned_long,_4UL>::operator[]
                ((array<unsigned_long,_4UL> *)
                 CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                 CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      in_stack_ffffffffffffff18 =
           ans_sint_decode::decode_sym<dec_entry_sint_small>
                     (in_stack_ffffffffffffff20,
                      (uint64_t *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                      (uint8_t **)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      *(uint32_t *)(in_RDI + 4 + local_c8 * 4) = in_stack_ffffffffffffff18;
      std::array<unsigned_long,_4UL>::operator[]
                ((array<unsigned_long,_4UL> *)
                 CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                 CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      in_stack_ffffffffffffff14 =
           ans_sint_decode::decode_sym<dec_entry_sint_small>
                     (in_stack_ffffffffffffff20,
                      (uint64_t *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                      (uint8_t **)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      *(uint32_t *)(in_RDI + 8 + local_c8 * 4) = in_stack_ffffffffffffff14;
      std::array<unsigned_long,_4UL>::operator[]
                ((array<unsigned_long,_4UL> *)
                 CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                 CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      in_stack_ffffffffffffff10 =
           ans_sint_decode::decode_sym<dec_entry_sint_small>
                     (in_stack_ffffffffffffff20,
                      (uint64_t *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                      (uint8_t **)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      *(uint32_t *)(in_RDI + 0xc + local_c8 * 4) = in_stack_ffffffffffffff10;
    }
    while (local_c8 != in_RSI) {
      std::array<unsigned_long,_4UL>::operator[]
                ((array<unsigned_long,_4UL> *)
                 CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                 CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      uVar1 = ans_sint_decode::decode_sym<dec_entry_sint_small>
                        (in_stack_ffffffffffffff20,
                         (uint64_t *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                         (uint8_t **)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      *(uint32_t *)(in_RDI + local_c8 * 4) = uVar1;
      local_c8 = local_c8 + 1;
    }
  }
  else {
    for (; local_c8 != uVar3; local_c8 = local_c8 + 4) {
      std::array<unsigned_long,_4UL>::operator[]
                ((array<unsigned_long,_4UL> *)
                 CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                 CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      uVar1 = ans_sint_decode::decode_sym<dec_entry_sint>
                        (in_stack_ffffffffffffff20,
                         (uint64_t *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                         (uint8_t **)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      *(uint32_t *)(in_RDI + local_c8 * 4) = uVar1;
      std::array<unsigned_long,_4UL>::operator[]
                ((array<unsigned_long,_4UL> *)
                 CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                 CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      in_stack_ffffffffffffff04 =
           ans_sint_decode::decode_sym<dec_entry_sint>
                     (in_stack_ffffffffffffff20,
                      (uint64_t *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                      (uint8_t **)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      *(uint32_t *)(in_RDI + 4 + local_c8 * 4) = in_stack_ffffffffffffff04;
      std::array<unsigned_long,_4UL>::operator[]
                ((array<unsigned_long,_4UL> *)
                 CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                 CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      in_stack_ffffffffffffff00 =
           ans_sint_decode::decode_sym<dec_entry_sint>
                     (in_stack_ffffffffffffff20,
                      (uint64_t *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                      (uint8_t **)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      *(uint32_t *)(in_RDI + 8 + local_c8 * 4) = in_stack_ffffffffffffff00;
      std::array<unsigned_long,_4UL>::operator[]
                ((array<unsigned_long,_4UL> *)
                 CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                 CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      in_stack_fffffffffffffefc =
           ans_sint_decode::decode_sym<dec_entry_sint>
                     (in_stack_ffffffffffffff20,
                      (uint64_t *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                      (uint8_t **)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      *(uint32_t *)(in_RDI + 0xc + local_c8 * 4) = in_stack_fffffffffffffefc;
    }
    while (local_c8 != in_RSI) {
      std::array<unsigned_long,_4UL>::operator[]
                ((array<unsigned_long,_4UL> *)
                 CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                 CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      in_stack_fffffffffffffef8 =
           ans_sint_decode::decode_sym<dec_entry_sint>
                     (in_stack_ffffffffffffff20,
                      (uint64_t *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                      (uint8_t **)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      *(uint32_t *)(in_RDI + local_c8 * 4) = in_stack_fffffffffffffef8;
      local_c8 = local_c8 + 1;
    }
  }
  ans_sint_decode::~ans_sint_decode
            ((ans_sint_decode *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  return;
}

Assistant:

void ans_sint_decompress(
    uint32_t* dst, size_t to_decode, const uint8_t* cSrc, size_t cSrcSize)
{
    const uint32_t num_states = 4;
    auto in_u8 = reinterpret_cast<const uint8_t*>(cSrc);
    auto ans_frame = ans_sint_decode::load(in_u8);
    in_u8 += cSrcSize;

    std::array<uint64_t, num_states> states;

    for (uint32_t i = 0; i < num_states; i++) {
        states[i] = ans_frame.init_state(in_u8);
    }
    size_t cur_idx = 0;
    auto out_u32 = reinterpret_cast<uint32_t*>(dst);
    size_t fast_decode = to_decode - (to_decode % num_states);
    if (ans_frame.table_type == dec_table_type_sint::SINT_SMALL) {
        while (cur_idx != fast_decode) {
            out_u32[cur_idx]
                = ans_frame.decode_sym<dec_entry_sint_small>(states[0], in_u8);
            out_u32[cur_idx + 1]
                = ans_frame.decode_sym<dec_entry_sint_small>(states[1], in_u8);
            out_u32[cur_idx + 2]
                = ans_frame.decode_sym<dec_entry_sint_small>(states[2], in_u8);
            out_u32[cur_idx + 3]
                = ans_frame.decode_sym<dec_entry_sint_small>(states[3], in_u8);
            cur_idx += num_states;
        }
        while (cur_idx != to_decode) {
            out_u32[cur_idx++] = ans_frame.decode_sym<dec_entry_sint_small>(
                states[num_states - 1], in_u8);
        }
    } else {
        while (cur_idx != fast_decode) {
            out_u32[cur_idx]
                = ans_frame.decode_sym<dec_entry_sint>(states[0], in_u8);
            out_u32[cur_idx + 1]
                = ans_frame.decode_sym<dec_entry_sint>(states[1], in_u8);
            out_u32[cur_idx + 2]
                = ans_frame.decode_sym<dec_entry_sint>(states[2], in_u8);
            out_u32[cur_idx + 3]
                = ans_frame.decode_sym<dec_entry_sint>(states[3], in_u8);
            cur_idx += num_states;
        }
        while (cur_idx != to_decode) {
            out_u32[cur_idx++] = ans_frame.decode_sym<dec_entry_sint>(
                states[num_states - 1], in_u8);
        }
    }
}